

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O3

int Sim_UtilCountSuppSizes(Sim_Man_t *p,int fStruct)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Abc_Ntk_t *pAVar4;
  void *pvVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ulong in_XMM10_Qa;
  uint uVar18;
  undefined8 in_XMM10_Qb;
  uint uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar25 [16];
  uint uVar26;
  
  pAVar4 = p->pNtk;
  uVar2 = pAVar4->vCos->nSize;
  if (fStruct == 0) {
    if ((int)uVar2 < 1) {
      return 0;
    }
    iVar3 = pAVar4->vCis->nSize;
    iVar1 = iVar3 + -1;
    auVar14._4_4_ = iVar1;
    auVar14._0_4_ = iVar1;
    auVar14._8_4_ = iVar1;
    auVar14._12_4_ = iVar1;
    uVar10 = 0;
    auVar14 = auVar14 ^ _DAT_0093d220;
    uVar8 = 0;
    do {
      if (0 < iVar3) {
        pvVar5 = p->vSuppFun->pArray[uVar10];
        uVar9 = 0;
        auVar11 = _DAT_0094a000;
        auVar12 = ZEXT416(uVar8);
        do {
          auVar22 = auVar12;
          auVar12 = auVar11 ^ _DAT_0093d220;
          auVar15._0_4_ = -(uint)(auVar14._0_4_ < auVar12._0_4_);
          auVar15._4_4_ = -(uint)(auVar14._4_4_ < auVar12._4_4_);
          auVar15._8_4_ = -(uint)(auVar14._8_4_ < auVar12._8_4_);
          auVar15._12_4_ = -(uint)(auVar14._12_4_ < auVar12._12_4_);
          if ((~auVar15._0_4_ & 1) != 0) {
            in_XMM10_Qa = (ulong)*(uint *)((long)pvVar5 + (ulong)(uVar9 >> 5) * 4);
            in_XMM10_Qb = 0;
          }
          auVar25._8_4_ = 0xffffffff;
          auVar25._0_8_ = 0xffffffffffffffff;
          auVar25._12_4_ = 0xffffffff;
          auVar21 = auVar15 ^ auVar25;
          if ((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            in_XMM10_Qa = CONCAT44(*(undefined4 *)((long)pvVar5 + (ulong)(uVar9 >> 5) * 4),
                                   (int)in_XMM10_Qa);
          }
          uVar8 = (uint)in_XMM10_Qa;
          if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            in_XMM10_Qb = CONCAT44((int)((ulong)in_XMM10_Qb >> 0x20),
                                   *(undefined4 *)((long)pvVar5 + (ulong)(uVar9 >> 5) * 4));
          }
          if ((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            uVar18 = *(uint *)((long)pvVar5 + (ulong)(uVar9 >> 5) * 4);
            auVar21._4_4_ = 0;
            auVar21._0_4_ = uVar18;
            auVar21._8_4_ = (int)in_XMM10_Qb;
            auVar21._12_4_ = (int)((ulong)in_XMM10_Qb >> 0x20);
            in_XMM10_Qb = CONCAT44(uVar18,(int)in_XMM10_Qb);
          }
          auVar12 = auVar11 & _DAT_009d0940;
          auVar25 = pshuflw(auVar21,auVar12,0xfe);
          uVar7 = in_XMM10_Qa >> 0x20;
          auVar21 = pshuflw(in_XMM14,auVar12,0x54);
          uVar19 = (uint)((ulong)in_XMM10_Qb >> 0x20);
          auVar24._8_4_ = auVar12._8_4_;
          auVar24._12_4_ = auVar12._12_4_;
          auVar24._0_8_ = auVar12._8_8_;
          in_XMM14 = pshuflw(auVar21,auVar24,0xfe);
          uVar26 = uVar19 >> in_XMM14._0_8_;
          auVar12 = pshuflw(auVar24,auVar24,0x54);
          uVar18 = (uint)in_XMM10_Qb >> auVar12._0_8_;
          in_XMM10_Qa = CONCAT44(uVar19 >> auVar12._0_8_,uVar18);
          in_XMM10_Qb = CONCAT44(uVar26,(uint)in_XMM10_Qb >> in_XMM14._0_8_);
          auVar12._0_4_ = (uVar8 >> auVar21._0_8_ & 1) + auVar22._0_4_;
          auVar12._4_4_ = ((uint)uVar7 >> auVar25._0_8_ & 1) + auVar22._4_4_;
          auVar12._8_4_ = (uVar18 & 1) + auVar22._8_4_;
          auVar12._12_4_ = (uVar26 & 1) + auVar22._12_4_;
          uVar9 = uVar9 + 4;
          auVar17._0_4_ = auVar11._0_4_ + 4;
          auVar17._4_4_ = auVar11._4_4_ + 4;
          auVar17._8_4_ = auVar11._8_4_ + 4;
          auVar17._12_4_ = auVar11._12_4_ + 4;
          auVar11 = auVar17;
        } while ((iVar3 + 3U & 0xfffffffc) != uVar9);
        auVar11 = ~auVar15 & auVar12 | auVar22 & auVar15;
        uVar8 = auVar11._12_4_ + auVar11._4_4_ + auVar11._8_4_ + auVar11._0_4_;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar2);
  }
  else {
    if ((int)uVar2 < 1) {
      return 0;
    }
    iVar3 = pAVar4->vCis->nSize;
    iVar1 = iVar3 + -1;
    auVar11._4_4_ = iVar1;
    auVar11._0_4_ = iVar1;
    auVar11._8_4_ = iVar1;
    auVar11._12_4_ = iVar1;
    uVar10 = 0;
    auVar11 = auVar11 ^ _DAT_0093d220;
    uVar8 = 0;
    do {
      if (0 < iVar3) {
        pvVar5 = p->vSuppStr->pArray[*(int *)((long)pAVar4->vCos->pArray[uVar10] + 0x10)];
        uVar9 = 0;
        auVar14 = _DAT_0094a000;
        auVar22 = ZEXT416(uVar8);
        do {
          auVar15 = auVar22;
          auVar12 = auVar14 ^ _DAT_0093d220;
          auVar13._0_4_ = -(uint)(auVar11._0_4_ < auVar12._0_4_);
          auVar13._4_4_ = -(uint)(auVar11._4_4_ < auVar12._4_4_);
          auVar13._8_4_ = -(uint)(auVar11._8_4_ < auVar12._8_4_);
          auVar13._12_4_ = -(uint)(auVar11._12_4_ < auVar12._12_4_);
          if ((~auVar13._0_4_ & 1) != 0) {
            in_XMM10_Qa = (ulong)*(uint *)((long)pvVar5 + (ulong)(uVar9 >> 5) * 4);
            in_XMM10_Qb = 0;
          }
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar20 = auVar13 ^ auVar6;
          if ((auVar20 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            in_XMM10_Qa = CONCAT44(*(undefined4 *)((long)pvVar5 + (ulong)(uVar9 >> 5) * 4),
                                   (int)in_XMM10_Qa);
          }
          uVar8 = (uint)in_XMM10_Qa;
          if ((auVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            in_XMM10_Qb = CONCAT44((int)((ulong)in_XMM10_Qb >> 0x20),
                                   *(undefined4 *)((long)pvVar5 + (ulong)(uVar9 >> 5) * 4));
          }
          if ((auVar20 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            uVar18 = *(uint *)((long)pvVar5 + (ulong)(uVar9 >> 5) * 4);
            auVar20._4_4_ = 0;
            auVar20._0_4_ = uVar18;
            auVar20._8_4_ = (int)in_XMM10_Qb;
            auVar20._12_4_ = (int)((ulong)in_XMM10_Qb >> 0x20);
            in_XMM10_Qb = CONCAT44(uVar18,(int)in_XMM10_Qb);
          }
          auVar22 = auVar14 & _DAT_009d0940;
          auVar12 = pshuflw(auVar20,auVar22,0xfe);
          uVar7 = in_XMM10_Qa >> 0x20;
          auVar25 = pshuflw(in_XMM14,auVar22,0x54);
          uVar19 = (uint)((ulong)in_XMM10_Qb >> 0x20);
          auVar23._8_4_ = auVar22._8_4_;
          auVar23._12_4_ = auVar22._12_4_;
          auVar23._0_8_ = auVar22._8_8_;
          in_XMM14 = pshuflw(auVar25,auVar23,0xfe);
          uVar26 = uVar19 >> in_XMM14._0_8_;
          auVar22 = pshuflw(auVar23,auVar23,0x54);
          uVar18 = (uint)in_XMM10_Qb >> auVar22._0_8_;
          in_XMM10_Qa = CONCAT44(uVar19 >> auVar22._0_8_,uVar18);
          in_XMM10_Qb = CONCAT44(uVar26,(uint)in_XMM10_Qb >> in_XMM14._0_8_);
          auVar22._0_4_ = (uVar8 >> auVar25._0_8_ & 1) + auVar15._0_4_;
          auVar22._4_4_ = ((uint)uVar7 >> auVar12._0_8_ & 1) + auVar15._4_4_;
          auVar22._8_4_ = (uVar18 & 1) + auVar15._8_4_;
          auVar22._12_4_ = (uVar26 & 1) + auVar15._12_4_;
          uVar9 = uVar9 + 4;
          auVar16._0_4_ = auVar14._0_4_ + 4;
          auVar16._4_4_ = auVar14._4_4_ + 4;
          auVar16._8_4_ = auVar14._8_4_ + 4;
          auVar16._12_4_ = auVar14._12_4_ + 4;
          auVar14 = auVar16;
        } while ((iVar3 + 3U & 0xfffffffc) != uVar9);
        auVar14 = ~auVar13 & auVar22 | auVar15 & auVar13;
        uVar8 = auVar14._12_4_ + auVar14._4_4_ + auVar14._8_4_ + auVar14._0_4_;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar2);
  }
  return uVar8;
}

Assistant:

int Sim_UtilCountSuppSizes( Sim_Man_t * p, int fStruct )
{
    Abc_Obj_t * pNode, * pNodeCi;
    int i, v, Counter;
    Counter = 0;
    if ( fStruct )
    {
        Abc_NtkForEachCo( p->pNtk, pNode, i )
            Abc_NtkForEachCi( p->pNtk, pNodeCi, v )
                Counter += Sim_SuppStrHasVar( p->vSuppStr, pNode, v );
    }
    else
    {
        Abc_NtkForEachCo( p->pNtk, pNode, i )
            Abc_NtkForEachCi( p->pNtk, pNodeCi, v )
                Counter += Sim_SuppFunHasVar( p->vSuppFun, i, v );
    }
    return Counter;
}